

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::anon_unknown_3::CreateContextExtCase::executeForSurface
          (CreateContextExtCase *this,EGLConfig config,EGLSurface surface)

{
  ostringstream *poVar1;
  EGLDisplay display;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *log;
  bool bVar2;
  bool bVar3;
  deUint32 dVar4;
  int iVar5;
  uint major;
  int iVar6;
  EGLenum EVar7;
  GLenum GVar8;
  Library *pLVar9;
  undefined4 extraout_var;
  int *piVar10;
  GLubyte *__s;
  EGLint flags;
  EGLint flags_00;
  EGLint mask;
  EGLint mask_00;
  EGLint flags_01;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  deInt32 contextFlagsGL;
  deInt32 strategy;
  deInt32 contextFlagsGL_1;
  string version;
  UniqueContext context;
  Functions gl;
  uint local_1c64;
  string local_1c60;
  int local_1c3c;
  Library *local_1c38;
  string local_1c30;
  long *local_1c10;
  long local_1c08;
  long local_1c00 [2];
  UniqueContext local_1bf0;
  undefined1 local_1bd8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1bc8 [6];
  ios_base local_1b60 [264];
  Functions local_1a58;
  
  pLVar9 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  (**pLVar9->_vptr_Library)(pLVar9,(ulong)this->m_api);
  dVar4 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
  eglu::checkError(dVar4,"bindAPI(m_api)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                   ,0x3b7);
  local_1c38 = pLVar9;
  glw::Functions::Functions(&local_1a58);
  display = this->m_display;
  iVar5 = (*pLVar9->_vptr_Library[6])
                    (pLVar9,display,config,0,
                     (this->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start);
  eglu::UniqueContext::UniqueContext
            (&local_1bf0,pLVar9,display,(EGLContext)CONCAT44(extraout_var,iVar5));
  dVar4 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
  eglu::checkError(dVar4,"eglCreateContext",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                   ,0x3bd);
  (*local_1c38->_vptr_Library[0x27])
            (local_1c38,this->m_display,surface,surface,local_1bf0.m_context);
  dVar4 = (*local_1c38->_vptr_Library[0x1f])();
  eglu::checkError(dVar4,"makeCurrent(m_display, surface, surface, *context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                   ,0x3bf);
  EglTestContext::initGLFunctions
            ((this->super_TestCase).m_eglTestCtx,&local_1a58,
             (ApiType)((this->m_glContextType).super_ApiType.m_bits & 0x3ff));
  piVar10 = (this->m_attribList).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  log = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = -1;
  uVar12 = 0xffffffff;
  uVar14 = 0xffffffff;
  uVar11 = 0xffffffff;
  local_1c3c = -1;
  uVar13 = 0xffffffff;
  uVar15 = 0xffffffff;
  do {
    while( true ) {
      while( true ) {
        while (iVar6 = *piVar10, 0x30fb < iVar6) {
          if (iVar6 < 0x3138) {
            if (iVar6 == 0x30fc) {
              uVar12 = piVar10[1];
              piVar10 = piVar10 + 2;
            }
            else if (iVar6 == 0x30fd) {
              uVar14 = piVar10[1];
              piVar10 = piVar10 + 2;
            }
          }
          else if (iVar6 == 0x3138) {
            uVar13 = piVar10[1];
            piVar10 = piVar10 + 2;
          }
          else if (iVar6 == 0x31bd) {
            uVar11 = piVar10[1];
            piVar10 = piVar10 + 2;
          }
        }
        if (iVar6 < 0x30bf) break;
        if (iVar6 == 0x30bf) {
          local_1c3c = piVar10[1];
          piVar10 = piVar10 + 2;
        }
        else if (iVar6 == 0x30fb) {
          iVar5 = piVar10[1];
          piVar10 = piVar10 + 2;
        }
      }
      if (iVar6 != 0x3098) break;
      uVar15 = piVar10[1];
      piVar10 = piVar10 + 2;
    }
  } while (iVar6 != 0x3038);
  __s = (*local_1a58.getString)(0x1f02);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c10,(char *)__s,(allocator<char> *)&local_1c60);
  local_1bd8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1bd8 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1bd8 + 8),"GL_VERSION: \'",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1bd8 + 8),(char *)local_1c10,local_1c08);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1bd8 + 8),"\'",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1bd8 + 8));
  std::ios_base::~ios_base(local_1b60);
  major = 1;
  if (uVar15 != 0xffffffff) {
    major = uVar15;
  }
  iVar6 = 0;
  if (iVar5 != -1) {
    iVar6 = iVar5;
  }
  if (this->m_api == 0x30a0) {
    bVar2 = checkVersionString((TestLog *)&log->_M_allocated_capacity,&local_1a58,false,major,iVar6)
    ;
    if (major != 3) goto LAB_001ff5da;
    bVar3 = checkVersionQueries((TestLog *)&log->_M_allocated_capacity,&local_1a58,3,iVar6);
    bVar2 = bVar2 && bVar3;
    EVar7 = this->m_api;
    if (uVar12 != 0xffffffff && EVar7 == 0x30a2) goto LAB_001ff5ff;
    if (uVar14 == 0xffffffff) goto LAB_001ff74b;
LAB_001ff769:
    if ((major != 3) || (1 < iVar6)) {
      local_1c64 = 0;
      (*local_1a58.getIntegerv)(0x9126,(GLint *)&local_1c64);
      GVar8 = (*local_1a58.getError)();
      glu::checkError(GVar8,"glGetIntegerv()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                      ,0x31a);
      if (uVar14 != local_1c64) {
        poVar1 = (ostringstream *)(local_1bd8 + 8);
        local_1bd8._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Invalid GL_CONTEXT_PROFILE_MASK. Expected \'",0x2b);
        (anonymous_namespace)::eglProfileMaskToString_abi_cxx11_
                  (&local_1c60,(_anonymous_namespace_ *)(ulong)uVar14,mask);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_1c60._M_dataplus._M_p,local_1c60._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\' got \'",7);
        (anonymous_namespace)::eglProfileMaskToString_abi_cxx11_
                  (&local_1c30,(_anonymous_namespace_ *)(ulong)local_1c64,mask_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   (char *)CONCAT44(local_1c30._M_dataplus._M_p._4_4_,
                                    (uint)local_1c30._M_dataplus._M_p),local_1c30._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\'",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1c30._M_dataplus._M_p._4_4_,(uint)local_1c30._M_dataplus._M_p) !=
            &local_1c30.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_1c30._M_dataplus._M_p._4_4_,
                                   (uint)local_1c30._M_dataplus._M_p),
                          local_1c30.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c60._M_dataplus._M_p != &local_1c60.field_2) {
          operator_delete(local_1c60._M_dataplus._M_p,local_1c60.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_1b60);
        bVar2 = false;
      }
    }
  }
  else {
    bVar2 = true;
    if ((this->m_api == 0x30a2) &&
       (bVar2 = checkVersionString((TestLog *)&log->_M_allocated_capacity,&local_1a58,true,major,
                                   iVar6), 2 < (int)major)) {
      bVar3 = checkVersionQueries((TestLog *)&log->_M_allocated_capacity,&local_1a58,major,iVar6);
      bVar2 = bVar2 && bVar3;
    }
LAB_001ff5da:
    if ((uVar12 != 0xffffffff) && (this->m_api == 0x30a2)) {
      if ((int)major < 4) {
LAB_001ff5ff:
        if ((major != 3) || (iVar6 < 1)) goto LAB_001ff72c;
      }
      (*local_1a58.getIntegerv)(0x821e,(GLint *)&local_1c64);
      if (uVar12 != local_1c64) {
        poVar1 = (ostringstream *)(local_1bd8 + 8);
        local_1bd8._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Invalid GL_CONTEXT_FLAGS. Expected \'",0x24);
        (anonymous_namespace)::eglContextFlagsToString_abi_cxx11_
                  (&local_1c60,(_anonymous_namespace_ *)(ulong)uVar12,flags);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_1c60._M_dataplus._M_p,local_1c60._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\' got \'",7);
        (anonymous_namespace)::eglContextFlagsToString_abi_cxx11_
                  (&local_1c30,(_anonymous_namespace_ *)(ulong)local_1c64,flags_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   (char *)CONCAT44(local_1c30._M_dataplus._M_p._4_4_,
                                    (uint)local_1c30._M_dataplus._M_p),local_1c30._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\'",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1c30._M_dataplus._M_p._4_4_,(uint)local_1c30._M_dataplus._M_p) !=
            &local_1c30.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_1c30._M_dataplus._M_p._4_4_,
                                   (uint)local_1c30._M_dataplus._M_p),
                          local_1c30.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c60._M_dataplus._M_p != &local_1c60.field_2) {
          operator_delete(local_1c60._M_dataplus._M_p,local_1c60.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_1b60);
        bVar2 = false;
      }
    }
LAB_001ff72c:
    if (uVar14 == 0xffffffff) {
      EVar7 = this->m_api;
LAB_001ff74b:
      if (EVar7 == 0x30a2) {
        uVar14 = 1;
        goto joined_r0x001ff763;
      }
    }
    else {
joined_r0x001ff763:
      if (2 < (int)major) goto LAB_001ff769;
    }
  }
  if ((uVar11 & uVar13) != 0xffffffff) {
    if (uVar11 != 0xffffffff) {
      uVar13 = uVar11;
    }
    local_1c60._M_dataplus._M_p = local_1c60._M_dataplus._M_p & 0xffffffff00000000;
    (*local_1a58.getIntegerv)(0x8256,(GLint *)&local_1c60);
    GVar8 = (*local_1a58.getError)();
    glu::checkError(GVar8,"glGetIntegerv()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                    ,0x32c);
    if ((int)local_1c60._M_dataplus._M_p == 0x8261 || uVar13 != 0x31be) {
      if ((int)local_1c60._M_dataplus._M_p == 0x8252 || uVar13 != 0x31bf) goto LAB_001ffa22;
      poVar1 = (ostringstream *)(local_1bd8 + 8);
      local_1bd8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"glGetIntegerv(GL_RESET_NOTIFICATION_STRATEGY) returned \'",0x38)
      ;
      std::ostream::operator<<(poVar1,(int)local_1c60._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\', expected \'GL_LOSE_CONTEXT_ON_RESET\'",0x26);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      poVar1 = (ostringstream *)(local_1bd8 + 8);
      local_1bd8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"glGetIntegerv(GL_RESET_NOTIFICATION_STRATEGY) returned \'",0x38)
      ;
      std::ostream::operator<<(poVar1,(int)local_1c60._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"\', expected \'GL_NO_RESET_NOTIFICATION\'",0x26);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1bd8 + 8));
    std::ios_base::~ios_base(local_1b60);
    bVar2 = false;
  }
LAB_001ffa22:
  if (local_1c3c != 1) goto LAB_001ffdd7;
  EVar7 = this->m_api;
  if (EVar7 == 0x30a0) {
    local_1c60._M_dataplus._M_p = (char *)0x11;
    local_1bd8._0_8_ = local_1bc8;
    local_1bd8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1bd8,(ulong)&local_1c60);
    local_1bc8[0]._M_allocated_capacity = local_1c60._M_dataplus._M_p;
    *(undefined8 *)local_1bd8._0_8_ = 0x725f5458455f4c47;
    ((TestLog *)(local_1bd8._0_8_ + 8))->m_log = (qpTestLog *)0x73656e747375626f;
    *(char *)&((TestLog *)(local_1bd8._0_8_ + 0x10))->m_log = 's';
    local_1bd8._8_8_ = local_1c60._M_dataplus._M_p;
    local_1c60._M_dataplus._M_p[local_1bd8._0_8_] = '\0';
    bVar3 = glu::hasExtension(&local_1a58,(ApiType)(iVar6 << 4 | major),(string *)local_1bd8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1bd8._0_8_ != local_1bc8) {
      operator_delete((void *)local_1bd8._0_8_,(ulong)(local_1bc8[0]._M_allocated_capacity + 1));
    }
    if (!bVar3) {
      local_1bd8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1bd8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1bd8 + 8),
                 "Created robustness context but it doesn\'t support GL_EXT_robustness.",0x44);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_001ffc03:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1bd8 + 8));
      std::ios_base::~ios_base(local_1b60);
      bVar2 = false;
    }
LAB_001ffc22:
    EVar7 = this->m_api;
  }
  else if (EVar7 == 0x30a2) {
    local_1c60._M_dataplus._M_p = (char *)0x11;
    local_1bd8._0_8_ = local_1bc8;
    local_1bd8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1bd8,(ulong)&local_1c60);
    local_1bc8[0]._M_allocated_capacity = local_1c60._M_dataplus._M_p;
    *(undefined8 *)local_1bd8._0_8_ = 0x725f4252415f4c47;
    ((TestLog *)(local_1bd8._0_8_ + 8))->m_log = (qpTestLog *)0x73656e747375626f;
    *(char *)&((TestLog *)(local_1bd8._0_8_ + 0x10))->m_log = 's';
    local_1bd8._8_8_ = local_1c60._M_dataplus._M_p;
    local_1c60._M_dataplus._M_p[local_1bd8._0_8_] = '\0';
    bVar3 = glu::hasExtension(&local_1a58,(ApiType)(iVar6 << 4 | major | 0x100),(string *)local_1bd8
                             );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1bd8._0_8_ != local_1bc8) {
      operator_delete((void *)local_1bd8._0_8_,(ulong)(local_1bc8[0]._M_allocated_capacity + 1));
    }
    if (!bVar3) {
      local_1bd8._0_8_ = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1bd8 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1bd8 + 8),
                 "Created robustness context but it doesn\'t support GL_ARB_robustness.",0x44);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_001ffc03;
    }
    goto LAB_001ffc22;
  }
  if (EVar7 == 0x30a0) {
    (*local_1a58.getBooleanv)(0x90f3,(GLboolean *)&local_1c30);
    GVar8 = (*local_1a58.getError)();
    glu::checkError(GVar8,"glGetBooleanv()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                    ,0x360);
    if ((char)local_1c30._M_dataplus._M_p == '\x01') goto LAB_001ffdd7;
    poVar1 = (ostringstream *)(local_1bd8 + 8);
    local_1bd8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid GL_CONTEXT_ROBUST_ACCESS returned by glGetBooleanv(). Got \'",0x43);
    local_1c60._M_dataplus._M_p._0_1_ = (char)local_1c30._M_dataplus._M_p;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1c60,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\' expected GL_TRUE.",0x13);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if ((EVar7 != 0x30a2) ||
       ((((int)major < 4 && ((major != 3 || (iVar6 < 1)))) ||
        ((*local_1a58.getIntegerv)(0x821e,(GLint *)&local_1c30),
        ((uint)local_1c30._M_dataplus._M_p & 4) == 0)))) goto LAB_001ffdd7;
    poVar1 = (ostringstream *)(local_1bd8 + 8);
    local_1bd8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "Invalid GL_CONTEXT_FLAGS. GL_CONTEXT_FLAG_ROBUST_ACCESS_BIT to be set, got \'",0x4c)
    ;
    (anonymous_namespace)::eglContextFlagsToString_abi_cxx11_
              (&local_1c60,(_anonymous_namespace_ *)(ulong)(uint)local_1c30._M_dataplus._M_p,
               flags_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_1c60._M_dataplus._M_p,local_1c60._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\'",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1bd8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c60._M_dataplus._M_p != &local_1c60.field_2) {
      operator_delete(local_1c60._M_dataplus._M_p,local_1c60.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1bd8 + 8));
  std::ios_base::~ios_base(local_1b60);
  bVar2 = false;
LAB_001ffdd7:
  if (local_1c10 != local_1c00) {
    operator_delete(local_1c10,local_1c00[0] + 1);
  }
  if (bVar2 == false) {
    this->m_isOk = false;
  }
  eglu::UniqueContext::~UniqueContext(&local_1bf0);
  pLVar9 = local_1c38;
  (*local_1c38->_vptr_Library[0x27])(local_1c38,this->m_display,0,0,0);
  dVar4 = (*pLVar9->_vptr_Library[0x1f])(pLVar9);
  eglu::checkError(dVar4,"makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateContextExtTests.cpp"
                   ,0x3d3);
  return;
}

Assistant:

void CreateContextExtCase::executeForSurface (EGLConfig config, EGLSurface surface)
{
	const Library&	egl		= m_eglTestCtx.getLibrary();

	EGLU_CHECK_CALL(egl, bindAPI(m_api));

	try
	{
		glw::Functions		gl;
		eglu::UniqueContext	context	(egl, m_display, egl.createContext(m_display, config, EGL_NO_CONTEXT, &m_attribList[0]));
		EGLU_CHECK_MSG(egl, "eglCreateContext");

		EGLU_CHECK_CALL(egl, makeCurrent(m_display, surface, surface, *context));

		m_eglTestCtx.initGLFunctions(&gl, m_glContextType.getAPI());

		if (!validateCurrentContext(gl))
			m_isOk = false;
	}
	catch (const eglu::Error& error)
	{
		if (error.getError() == EGL_BAD_MATCH)
			m_testCtx.getLog() << TestLog::Message << "Context creation failed with error EGL_BAD_CONTEXT. Config doesn't support api version." << TestLog::EndMessage;
		else if (error.getError() == EGL_BAD_CONFIG)
			m_testCtx.getLog() << TestLog::Message << "Context creation failed with error EGL_BAD_MATCH. Context attribute compination not supported." << TestLog::EndMessage;
		else
		{
			m_testCtx.getLog() << TestLog::Message << "Context creation failed with error " << eglu::getErrorStr(error.getError()) << ". Error is not result of unsupported api etc." << TestLog::EndMessage;
			m_isOk = false;
		}
	}

	EGLU_CHECK_CALL(egl, makeCurrent(m_display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
}